

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::
basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
::int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_>::on_hex
          (int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_> *this)

{
  char cVar1;
  uint uVar2;
  format_specs *pfVar3;
  ulong uVar4;
  hex_writer f;
  ulong uVar5;
  int num_digits;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  string_view prefix;
  undefined4 uStack_4;
  
  pfVar3 = this->specs;
  if ((char)pfVar3->field_0x9 < '\0') {
    uVar2 = this->prefix_size;
    this->prefix_size = uVar2 + 1;
    this->prefix[uVar2] = '0';
    cVar1 = pfVar3->type;
    uVar2 = this->prefix_size;
    this->prefix_size = uVar2 + 1;
    this->prefix[uVar2] = cVar1;
  }
  num_digits = 0;
  uVar5 = (ulong)this->abs_value;
  uVar6 = *(ulong *)((long)&this->abs_value + 8);
  do {
    num_digits = num_digits + 1;
    bVar7 = 0xf < uVar5;
    bVar8 = uVar6 != 0;
    uVar4 = -uVar6;
    uVar5 = uVar6 << 0x3c | uVar5 >> 4;
    uVar6 = uVar6 >> 4;
  } while (bVar8 || uVar4 < bVar7);
  f._12_4_ = uStack_4;
  f.num_digits = num_digits;
  f.self = this;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
  ::
  write_int<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<char>>::hex_writer>
            ((basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
              *)this->writer,num_digits,prefix,*pfVar3,f);
  return;
}

Assistant:

void on_hex() {
      if (specs.alt) {
        prefix[prefix_size++] = '0';
        prefix[prefix_size++] = specs.type;
      }
      int num_digits = count_digits<4>(abs_value);
      writer.write_int(num_digits, get_prefix(), specs,
                       hex_writer{*this, num_digits});
    }